

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O3

int soplex::dlcmSizeRational(Rational *vector,int length,int base)

{
  uint new_size;
  int iVar1;
  ulong uVar2;
  undefined8 __src;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  *__src_00;
  undefined8 uVar3;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  *pnVar4;
  Integer lcm;
  data_type local_d8;
  uint local_c8;
  undefined2 local_c4;
  byte local_c2;
  data_type local_b8;
  uint local_a8;
  undefined1 local_a4;
  byte local_a3;
  byte local_a2;
  data_type local_98;
  uint local_88;
  undefined1 local_84;
  byte local_83;
  byte local_82;
  data_type local_78;
  char local_63;
  char local_62;
  uint local_58;
  void *local_50;
  char local_43;
  char local_42;
  
  local_d8.la[0] = 1;
  local_c8 = 1;
  local_c4 = 0x100;
  local_c2 = 0;
  if (0 < length) {
    uVar2 = (ulong)(uint)length;
    pnVar4 = &(vector->m_backend).m_value.den;
    do {
      local_98.la[0] = 0;
      local_88 = 0;
      if (local_c2 != 0) {
        local_88 = local_c8;
      }
      local_84 = (undefined1)local_c4;
      local_83 = local_c2 ^ 1;
      local_82 = local_c2;
      if (local_c2 == 1) {
        local_98.la[0] = local_d8.la[0];
        local_98.ld.data = local_d8.ld.data;
      }
      else {
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_98.ld,local_c8,local_c8);
        uVar3 = &local_98;
        if (local_83 == 0) {
          uVar3 = local_98.ld.data;
        }
        __src = &local_d8;
        if (local_c4._1_1_ == '\0') {
          __src = local_d8.ld.data;
        }
        memcpy((void *)uVar3,(void *)__src,(ulong)local_c8 << 3);
      }
      local_b8.la[0] = 0;
      local_a2 = (pnVar4->m_backend).
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_alias;
      new_size = (pnVar4->m_backend).
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_limbs;
      local_a8 = 0;
      if ((bool)local_a2 != false) {
        local_a8 = new_size;
      }
      local_a4 = (pnVar4->m_backend).
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_sign;
      local_a3 = local_a2 ^ 1;
      if ((bool)local_a2 == true) {
        local_b8.la[0] =
             (pnVar4->m_backend).
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_data.la[0];
        local_b8.ld.data =
             (pnVar4->m_backend).
             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
             .m_data.ld.data;
      }
      else {
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_b8.ld,new_size,new_size);
        uVar3 = &local_b8;
        if (local_a3 == 0) {
          uVar3 = local_b8.ld.data;
        }
        __src_00 = pnVar4;
        if ((pnVar4->m_backend).
            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            .m_internal == false) {
          __src_00 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                      *)(pnVar4->m_backend).
                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        .m_data.ld.data;
        }
        memcpy((void *)uVar3,__src_00,
               (ulong)(pnVar4->m_backend).
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_limbs << 3);
      }
      boost::multiprecision::default_ops::
      eval_lcm<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_d8.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_98.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_b8.ld);
      if ((local_a3 == 0) && (local_a2 == 0)) {
        operator_delete(local_b8.ld.data,(local_b8.la[0] & 0xffffffff) << 3);
      }
      if ((local_83 == 0) && (local_82 == 0)) {
        operator_delete(local_98.ld.data,(local_98.la[0] & 0xffffffff) << 3);
      }
      pnVar4 = pnVar4 + 2;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  boost::
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
  ::
  rational<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
              *)&local_78.ld,
             (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
              *)&local_d8.ld,(type *)0x0);
  iVar1 = sizeInBase((Rational *)&local_78.ld,base);
  if ((local_43 == '\0') && (local_42 == '\0')) {
    operator_delete(local_50,(ulong)local_58 << 3);
  }
  if ((local_63 == '\0') && (local_62 == '\0')) {
    operator_delete(local_78.ld.data,(ulong)local_78.ld.capacity << 3);
  }
  if ((local_c4._1_1_ == '\0') && (local_c2 == 0)) {
    operator_delete(local_d8.ld.data,(local_d8.la[0] & 0xffffffff) << 3);
  }
  return iVar1 + 1;
}

Assistant:

inline int dlcmSizeRational(const Rational* vector, const int length, const int base)
{
   assert(vector != nullptr);
   assert(length >= 0);

#ifndef SOPLEX_WITH_BOOST
   SPX_MSG_ERROR(std::cerr << "ERROR: rational solve without Boost not defined!" << std::endl;)
   return 0;
#else

   Integer lcm = 1;

   for(int i = 0; i < length; i++)
      SpxLcm(lcm, lcm, denominator(vector[i]));

   int size = sizeInBase(Rational(lcm), base) + 1;

   return size;
#endif
}